

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
               (Buffer *buffer,int *exp)

{
  char cVar1;
  ushort *puVar2;
  ushort *puVar3;
  ushort *puVar4;
  
  puVar4 = (ushort *)buffer->begin;
  if (buffer->end <= puVar4) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3fc,
                  "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const");
  }
  puVar3 = (ushort *)((long)buffer->end + -1);
  do {
    puVar2 = puVar3;
    cVar1 = (char)*puVar2;
    if (cVar1 != '.') {
      if (cVar1 != '9') {
        *(char *)puVar2 = cVar1 + '\x01';
        return;
      }
      *(char *)puVar2 = '0';
      puVar4 = (ushort *)buffer->begin;
    }
    puVar3 = (ushort *)((long)puVar2 + -1);
  } while (puVar4 <= puVar3);
  *(char *)puVar3 = '1';
  buffer->begin = (char *)puVar3;
  *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
  *exp = *exp + 1;
  if (buffer->begin < buffer->end) {
    buffer->end = buffer->end + -1;
    return;
  }
  __assert_fail("begin < end",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x3f7,"void absl::str_format_internal::(anonymous namespace)::Buffer::pop_back()");
}

Assistant:

void RoundUp(Buffer *buffer, int *exp) {
  char *p = &buffer->back();
  while (p >= buffer->begin && (*p == '9' || *p == '.')) {
    if (*p == '9') *p = '0';
    --p;
  }

  if (p < buffer->begin) {
    *p = '1';
    buffer->begin = p;
    if (mode == FormatStyle::Precision) {
      std::swap(p[1], p[2]);  // move the .
      ++*exp;
      buffer->pop_back();
    }
  } else {
    ++*p;
  }
}